

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateThread
                    (CPalThread *pThread,LPSECURITY_ATTRIBUTES lpThreadAttributes,DWORD dwStackSize,
                    LPTHREAD_START_ROUTINE lpStartAddress,LPVOID lpParameter,DWORD dwCreationFlags,
                    PalThreadType eThreadType,SIZE_T *pThreadId,HANDLE *phThread)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  SIZE_T SVar5;
  long in_FS_OFFSET;
  size_t MinStackSize;
  size_t alignedStackSize;
  int iError;
  BOOL fHoldingProcessLock;
  pthread_t pthread;
  HANDLE hNewThread;
  undefined1 local_98 [6];
  bool fThreadDataAddedToProcessList;
  bool fAttributesInitialized;
  CObjectAttributes oa;
  CPalThread *pNewThread;
  PAL_ERROR palError;
  DWORD dwCreationFlags_local;
  LPVOID lpParameter_local;
  LPTHREAD_START_ROUTINE lpStartAddress_local;
  DWORD dwStackSize_local;
  LPSECURITY_ATTRIBUTES lpThreadAttributes_local;
  CPalThread *pThread_local;
  pthread_attr_t pthreadAttr;
  
  pthreadAttr._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_98);
  hNewThread._7_1_ = 0;
  hNewThread._6_1_ = 0;
  pthread = 0;
  alignedStackSize._4_4_ = 0;
  alignedStackSize._0_4_ = 0;
  if (lpThreadAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    MinStackSize = (size_t)dwStackSize;
    if (MinStackSize != 0) {
      MinStackSize = ALIGN_UP(MinStackSize,0x1000);
    }
    uVar2 = dwCreationFlags & 0xfffeffff;
    if ((uVar2 == 0) || (uVar2 == 4)) {
      oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)AllocTHREAD();
      if ((CPalThread *)oa.pSecurityAttributes == (CPalThread *)0x0) {
        pNewThread._0_4_ = 0xe;
      }
      else {
        pNewThread._0_4_ =
             CPalThread::RunPreCreateInitializers((CPalThread *)oa.pSecurityAttributes);
        if ((PAL_ERROR)pNewThread == 0) {
          *(LPTHREAD_START_ROUTINE *)(oa.pSecurityAttributes + 9) = lpStartAddress;
          oa.pSecurityAttributes[9].lpSecurityDescriptor = lpParameter;
          oa.pSecurityAttributes[9].bInheritHandle = (uint)((dwCreationFlags & 4) == 4);
          oa.pSecurityAttributes[10].nLength = eThreadType;
          iVar3 = pthread_attr_init((pthread_attr_t *)&pThread_local);
          if (iVar3 == 0) {
            hNewThread._7_1_ = 1;
            iVar3 = pthread_attr_getstacksize((pthread_attr_t *)&pThread_local,&MinStackSize);
            if (iVar3 == 0) {
              if (MinStackSize == 0) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
              }
              else {
                sVar4 = __sysconf(0x4b);
                sVar4 = ALIGN_UP(sVar4,0x1000);
                if (MinStackSize < sVar4) {
                  MinStackSize = sVar4;
                }
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                iVar3 = pthread_attr_setstacksize((pthread_attr_t *)&pThread_local,MinStackSize);
                if (iVar3 != 0) {
                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                  pNewThread._0_4_ = 0x54f;
                  goto LAB_003cfa6f;
                }
              }
              alignedStackSize._0_4_ =
                   pthread_attr_setdetachstate((pthread_attr_t *)&pThread_local,1);
              if ((int)alignedStackSize != 0) {
                fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                        ,0x27e,"0 == iError","");
                fflush(_stderr);
                abort();
              }
              pNewThread._0_4_ =
                   CreateThreadObject(pThread,(CPalThread *)oa.pSecurityAttributes,
                                      (HANDLE *)&pthread);
              if ((PAL_ERROR)pNewThread == 0) {
                PROCProcessLock();
                alignedStackSize._4_4_ = 1;
                PROCAddThread(pThread,(CPalThread *)oa.pSecurityAttributes);
                hNewThread._6_1_ = 1;
                alignedStackSize._0_4_ =
                     pthread_create((pthread_t *)&iError,(pthread_attr_t *)&pThread_local,
                                    CPalThread::ThreadEntry,oa.pSecurityAttributes);
                if ((int)alignedStackSize == 0) {
                  bVar1 = CPalThread::WaitForStartStatus((CPalThread *)oa.pSecurityAttributes);
                  if (bVar1) {
                    *phThread = (HANDLE)pthread;
                    if (pThreadId != (SIZE_T *)0x0) {
                      SVar5 = CPalThread::GetThreadId((CPalThread *)oa.pSecurityAttributes);
                      *pThreadId = SVar5;
                    }
                    PROCProcessUnlock();
                    alignedStackSize._4_4_ = 0;
                  }
                  else {
                    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                      abort();
                    }
                    pNewThread._0_4_ = 0x54f;
                  }
                }
                else {
                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                  strerror((int)alignedStackSize);
                  pNewThread._0_4_ = 8;
                }
              }
            }
            else {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pNewThread._0_4_ = 0x54f;
            }
          }
          else {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pNewThread._0_4_ = 0x54f;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalCreateThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x229);
      fprintf(_stderr,"dwCreationFlags parameter is invalid (%#x)\n",(ulong)uVar2);
      pNewThread._0_4_ = 0x57;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x20e);
    fprintf(_stderr,"lpThreadAttributes parameter must be NULL (%p)\n",lpThreadAttributes);
    pNewThread._0_4_ = 0x57;
  }
LAB_003cfa6f:
  if ((((hNewThread._7_1_ & 1) != 0) &&
      (iVar3 = pthread_attr_destroy((pthread_attr_t *)&pThread_local), iVar3 != 0)) &&
     ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
    abort();
  }
  if ((PAL_ERROR)pNewThread != 0) {
    if ((hNewThread._6_1_ & 1) != 0) {
      PROCRemoveThread(pThread,(CPalThread *)oa.pSecurityAttributes);
    }
    if (alignedStackSize._4_4_ != 0) {
      PROCProcessUnlock();
    }
    alignedStackSize._4_4_ = 0;
  }
  if (alignedStackSize._4_4_ != 0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x2fa);
    fprintf(_stderr,
            "Expression: !fHoldingProcessLock, Description: Exiting InternalCreateThread while still holding the process critical section.\n"
           );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != pthreadAttr._48_8_) {
    __stack_chk_fail();
  }
  return (PAL_ERROR)pNewThread;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateThread(
    CPalThread *pThread,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    DWORD dwStackSize,
    LPTHREAD_START_ROUTINE lpStartAddress,
    LPVOID lpParameter,
    DWORD dwCreationFlags,
    PalThreadType eThreadType,
    SIZE_T* pThreadId,
    HANDLE *phThread
    )
{
    PAL_ERROR palError;
    CPalThread *pNewThread = NULL;
    CObjectAttributes oa;
    bool fAttributesInitialized = FALSE;
    bool fThreadDataAddedToProcessList = FALSE;
    HANDLE hNewThread = NULL;

    pthread_t pthread;
    pthread_attr_t pthreadAttr;
#if PTHREAD_CREATE_MODIFIES_ERRNO
    int storedErrno;
#endif  // PTHREAD_CREATE_MODIFIES_ERRNO
    BOOL fHoldingProcessLock = FALSE;
    int iError = 0;
    size_t alignedStackSize;

    /* Validate parameters */

    if (lpThreadAttributes != NULL)
    {
        ASSERT("lpThreadAttributes parameter must be NULL (%p)\n",
               lpThreadAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto EXIT;
    }

    alignedStackSize = dwStackSize;
    if (alignedStackSize != 0)
    {
        // Some systems require the stack size to be aligned to the page size
        if (sizeof(alignedStackSize) <= sizeof(dwStackSize) && alignedStackSize + (VIRTUAL_PAGE_SIZE - 1) < alignedStackSize)
        {
            // When coming here from the public API surface, the incoming value is originally a nonnegative signed int32, so
            // this shouldn't happen
            ASSERT(
                "Couldn't align the requested stack size (%zu) to the page size because the stack size was too large\n",
                alignedStackSize);
            palError = ERROR_INVALID_PARAMETER;
            goto EXIT;
        }
        alignedStackSize = ALIGN_UP(alignedStackSize, VIRTUAL_PAGE_SIZE);
    }

    // Ignore the STACK_SIZE_PARAM_IS_A_RESERVATION flag
    dwCreationFlags &= ~STACK_SIZE_PARAM_IS_A_RESERVATION;

    if ((dwCreationFlags != 0) && (dwCreationFlags != CREATE_SUSPENDED))
    {
        ASSERT("dwCreationFlags parameter is invalid (%#x)\n", dwCreationFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto EXIT;
    }

    //
    // Create the CPalThread for the thread
    //

    pNewThread = AllocTHREAD();
    if (NULL == pNewThread)
    {
        palError = ERROR_OUTOFMEMORY;
        goto EXIT;
    }

    palError = pNewThread->RunPreCreateInitializers();
    if (NO_ERROR != palError)
    {
        goto EXIT;
    }

    pNewThread->m_lpStartAddress = lpStartAddress;
    pNewThread->m_lpStartParameter = lpParameter;
    pNewThread->m_bCreateSuspended = (dwCreationFlags & CREATE_SUSPENDED) == CREATE_SUSPENDED;
    pNewThread->m_eThreadType = eThreadType;

    if (0 != pthread_attr_init(&pthreadAttr))
    {
        ERROR("couldn't initialize pthread attributes\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    fAttributesInitialized = TRUE;

    /* adjust the stack size if necessary */
    if (0 != pthread_attr_getstacksize(&pthreadAttr, &alignedStackSize))
    {
        ERROR("couldn't set thread stack size\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    /* adjust the stack size if necessary */
    if (alignedStackSize != 0)
    {
#ifdef PTHREAD_STACK_MIN
        size_t MinStackSize = ALIGN_UP(PTHREAD_STACK_MIN, VIRTUAL_PAGE_SIZE);
#else // !PTHREAD_STACK_MIN
        size_t MinStackSize = 64 * 1024; // this value is typically accepted by pthread_attr_setstacksize()
#endif // PTHREAD_STACK_MIN
        if (alignedStackSize < MinStackSize)
        {
            // Adjust the stack size to a minimum value that is likely to be accepted by pthread_attr_setstacksize(). If this
            // function fails, typically the caller will end up throwing OutOfMemoryException under the assumption that the
            // requested stack size is too large or the system does not have sufficient memory to create a thread. Try to
            // prevent failing just just because the stack size value is too low.
            alignedStackSize = MinStackSize;
        }

        TRACE("setting thread stack size to %zu\n", alignedStackSize);
        if (0 != pthread_attr_setstacksize(&pthreadAttr, alignedStackSize))
        {
            ERROR("couldn't set pthread stack size to %zu\n", alignedStackSize);
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
    }
    else
    {
        TRACE("using the system default thread stack size\n");
    }

#if HAVE_THREAD_SELF || HAVE__LWP_SELF
    /* Create new threads as "bound", so each pthread is permanently bound
       to an LWP.  Get/SetThreadContext() depend on this 1:1 mapping. */
    pthread_attr_setscope(&pthreadAttr, PTHREAD_SCOPE_SYSTEM);
#endif // HAVE_THREAD_SELF || HAVE__LWP_SELF

    //
    // We never call pthread_join, so create the new thread as detached
    //

    iError = pthread_attr_setdetachstate(&pthreadAttr, PTHREAD_CREATE_DETACHED);
    _ASSERTE(0 == iError);

    //
    // Create the IPalObject for the thread and store it in the object
    //

    palError = CreateThreadObject(
        pThread,
        pNewThread,
        &hNewThread);

    if (NO_ERROR != palError)
    {
        goto EXIT;
    }

    //
    // Add the thread to the process list
    //

    //
    // We use the process lock to ensure that we're not interrupted
    // during the creation process. After adding the CPalThread reference
    // to the process list, we want to make sure the actual thread has been
    // started. Otherwise, there's a window where the thread can be found
    // in the process list but doesn't yet exist in the system.
    //

    PROCProcessLock();
    fHoldingProcessLock = TRUE;

    PROCAddThread(pThread, pNewThread);
    fThreadDataAddedToProcessList = TRUE;

    //
    // Spawn the new pthread
    //

#if PTHREAD_CREATE_MODIFIES_ERRNO
    storedErrno = errno;
#endif  // PTHREAD_CREATE_MODIFIES_ERRNO

    iError = pthread_create(&pthread, &pthreadAttr, CPalThread::ThreadEntry, pNewThread);

#if PTHREAD_CREATE_MODIFIES_ERRNO
    if (iError == 0)
    {
        // Restore errno if pthread_create succeeded.
        errno = storedErrno;
    }
#endif  // PTHREAD_CREATE_MODIFIES_ERRNO

    if (0 != iError)
    {
        ERROR("pthread_create failed, error is %d (%s)\n", iError, strerror(iError));
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto EXIT;
    }

    //
    // Wait for the new thread to finish its initial startup tasks
    // (i.e., the ones that might fail)
    //
    if (pNewThread->WaitForStartStatus())
    {
        //
        // Everything succeeded. Store the handle for the new thread and
        // the thread's ID in the out params
        //
        *phThread = hNewThread;

        if (NULL != pThreadId)
        {
            *pThreadId = pNewThread->GetThreadId();
        }
    }
    else
    {
        ERROR("error occurred in THREADEntry, thread creation failed.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    //
    // If we're here, then we've locked the process list and both pthread_create
    // and WaitForStartStatus succeeded. Thus, we can now unlock the process list.
    // Since palError == NO_ERROR, we won't call this again in the exit block.
    //
    PROCProcessUnlock();
    fHoldingProcessLock = FALSE;

EXIT:

    if (fAttributesInitialized)
    {
        if (0 != pthread_attr_destroy(&pthreadAttr))
        {
            WARN("pthread_attr_destroy() failed\n");
        }
    }

    if (NO_ERROR != palError)
    {
        //
        // We either were not able to create the new thread, or a failure
        // occurred in the new thread's entry routine. Free up the associated
        // resources here
        //

        if (fThreadDataAddedToProcessList)
        {
            PROCRemoveThread(pThread, pNewThread);
        }
        //
        // Once we remove the thread from the process list, we can call
        // PROCProcessUnlock.
        //
        if (fHoldingProcessLock)
        {
            PROCProcessUnlock();
        }
        fHoldingProcessLock = FALSE;
    }

    _ASSERT_MSG(!fHoldingProcessLock, "Exiting InternalCreateThread while still holding the process critical section.\n");

    return palError;
}